

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::releaseMouse(QWidget *this)

{
  QWindow *pQVar1;
  
  if ((qt_mouseGrb == this) && (pQVar1 = grabberWindow(this), pQVar1 != (QWindow *)0x0)) {
    if (mouseGrabWithCursor == '\x01') {
      QGuiApplication::restoreOverrideCursor();
      mouseGrabWithCursor = '\0';
    }
    QWindow::setMouseGrabEnabled(SUB81(pQVar1,0));
  }
  qt_mouseGrb = (QWidget *)0x0;
  return;
}

Assistant:

static void releaseMouseGrabOfWidget(QWidget *widget)
{
    if (qt_mouseGrb == widget) {
        if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
            if (mouseGrabWithCursor) {
                QGuiApplication::restoreOverrideCursor();
                mouseGrabWithCursor = false;
            }
#endif // !QT_NO_CURSOR
            window->setMouseGrabEnabled(false);
        }
    }
    qt_mouseGrb = nullptr;
}